

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O0

string * __thiscall
(anonymous_namespace)::ValueToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,size_t value)

{
  size_t value_local;
  
  std::__cxx11::to_string(__return_storage_ptr__,(unsigned_long)this);
  return __return_storage_ptr__;
}

Assistant:

std::string ValueToString(std::size_t const value)
{
  return std::to_string(value);
}